

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O0

void INT_EVdfg_dump_graph(EVdfg_state_type which,EVdfg dfg)

{
  int in_EDI;
  
  if (in_EDI == 0) {
    dump_dfg_gml((EVdfg_configuration)0x163464);
  }
  else if (in_EDI == 1) {
    dump_dfg_gml((EVdfg_configuration)0x163474);
  }
  return;
}

Assistant:

void
INT_EVdfg_dump_graph(EVdfg_state_type which, EVdfg dfg)
{
    switch(which) {
    case EVdfgWorking:
	dump_dfg_gml(dfg->working_state);
	break;
    case EVdfgDeployed:
	dump_dfg_gml(dfg->deployed_state);
	break;
    }
}